

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

uint32_t mpack_expect_map_range(mpack_reader_t *reader,uint32_t min_value,uint32_t max_value)

{
  uint32_t uVar1;
  mpack_error_t mVar2;
  uint32_t val;
  uint32_t max_value_local;
  uint32_t min_value_local;
  mpack_reader_t *reader_local;
  
  uVar1 = mpack_expect_map(reader);
  mVar2 = mpack_reader_error(reader);
  reader_local._4_4_ = min_value;
  if ((mVar2 == mpack_ok) &&
     ((uVar1 < min_value || (reader_local._4_4_ = uVar1, max_value < uVar1)))) {
    mpack_reader_flag_error(reader,mpack_error_type);
    reader_local._4_4_ = min_value;
  }
  return reader_local._4_4_;
}

Assistant:

uint32_t mpack_expect_map_range(mpack_reader_t* reader, uint32_t min_value, uint32_t max_value) {MPACK_EXPECT_RANGE_IMPL(map, uint32_t)}